

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::DualizeIPMStartingPoint
          (Model *this,Vector *x_user,Vector *xl_user,Vector *xu_user,Vector *slack_user,
          Vector *y_user,Vector *zl_user,Vector *zu_user,Vector *x_solver,Vector *xl_solver,
          Vector *xu_solver,Vector *y_solver,Vector *zl_solver,Vector *zu_solver)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double **local_40;
  
  if (this->dualized_ == false) {
    uVar2 = this->num_rows_;
    lVar10 = (long)this->num_cols_;
    if (0 < (long)this->num_var_) {
      pdVar9 = (double *)x_solver->_M_size;
      if (pdVar9 != (double *)0x0) {
        pdVar9 = x_solver->_M_data;
      }
      pdVar8 = (double *)x_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = x_user->_M_data;
      }
      memmove(pdVar9,pdVar8,(long)this->num_var_ << 3);
    }
    if (0 < (long)this->num_constr_) {
      pdVar9 = (double *)x_solver->_M_size;
      if (pdVar9 != (double *)0x0) {
        pdVar9 = x_solver->_M_data;
      }
      pdVar8 = (double *)slack_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = slack_user->_M_data;
      }
      memmove(pdVar9 + lVar10,pdVar8,(long)this->num_constr_ << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar9 = (double *)xl_solver->_M_size;
      if (pdVar9 != (double *)0x0) {
        pdVar9 = xl_solver->_M_data;
      }
      pdVar8 = (double *)xl_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = xl_user->_M_data;
      }
      memmove(pdVar9,pdVar8,(long)this->num_var_ << 3);
      if (0 < (long)this->num_var_) {
        pdVar9 = (double *)xu_solver->_M_size;
        if (pdVar9 != (double *)0x0) {
          pdVar9 = xu_solver->_M_data;
        }
        pdVar8 = (double *)xu_user->_M_size;
        if (pdVar8 != (double *)0x0) {
          pdVar8 = xu_user->_M_data;
        }
        memmove(pdVar9,pdVar8,(long)this->num_var_ << 3);
      }
    }
    local_40 = &xu_solver->_M_data;
    if (0 < (long)this->num_constr_) {
      pdVar9 = (double *)y_solver->_M_size;
      if (pdVar9 != (double *)0x0) {
        pdVar9 = y_solver->_M_data;
      }
      pdVar8 = (double *)y_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = y_user->_M_data;
      }
      memmove(pdVar9,pdVar8,(long)this->num_constr_ << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar9 = (double *)zl_solver->_M_size;
      if (pdVar9 != (double *)0x0) {
        pdVar9 = zl_solver->_M_data;
      }
      pdVar8 = (double *)zl_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = zl_user->_M_data;
      }
      memmove(pdVar9,pdVar8,(long)this->num_var_ << 3);
      if (0 < (long)this->num_var_) {
        pdVar9 = (double *)zu_solver->_M_size;
        if (pdVar9 != (double *)0x0) {
          pdVar9 = zu_solver->_M_data;
        }
        pdVar8 = (double *)zu_user->_M_size;
        if (pdVar8 != (double *)0x0) {
          pdVar8 = zu_user->_M_data;
        }
        memmove(pdVar9,pdVar8,(long)this->num_var_ << 3);
      }
    }
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = slack_user->_M_data;
    pdVar8 = y_user->_M_data;
    pdVar4 = zu_solver->_M_data;
    uVar12 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar12;
    }
    pdVar5 = xl_solver->_M_data;
    pdVar6 = *local_40;
    pdVar7 = zl_solver->_M_data;
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      cVar1 = pcVar3[uVar12];
      if (cVar1 == '<') {
        pdVar5[lVar10 + uVar12] = pdVar9[uVar12];
        pdVar6[lVar10 + uVar12] = INFINITY;
        pdVar7[lVar10 + uVar12] = -pdVar8[uVar12];
LAB_0038865d:
        dVar13 = 0.0;
LAB_00388660:
        pdVar4[uVar12 + lVar10] = dVar13;
      }
      else {
        if (cVar1 == '>') {
          pdVar5[lVar10 + uVar12] = INFINITY;
          pdVar6[lVar10 + uVar12] = -pdVar9[uVar12];
          pdVar7[lVar10 + uVar12] = 0.0;
          dVar13 = pdVar8[uVar12];
          goto LAB_00388660;
        }
        if (cVar1 == '=') {
          pdVar5[lVar10 + uVar12] = 0.0;
          pdVar6[lVar10 + uVar12] = 0.0;
          pdVar7[lVar10 + uVar12] = 0.0;
          goto LAB_0038865d;
        }
      }
    }
  }
  return;
}

Assistant:

void Model::DualizeIPMStartingPoint(const Vector& x_user,
                                    const Vector& xl_user,
                                    const Vector& xu_user,
                                    const Vector& slack_user,
                                    const Vector& y_user,
                                    const Vector& zl_user,
                                    const Vector& zu_user,
                                    Vector& x_solver,
                                    Vector& xl_solver,
                                    Vector& xu_solver,
                                    Vector& y_solver,
                                    Vector& zl_solver,
                                    Vector& zu_solver) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        // Not implemented.
        assert(false);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);

        std::copy_n(std::begin(x_user), num_var_, std::begin(x_solver));
        std::copy_n(std::begin(slack_user), num_constr_,
                    std::begin(x_solver) + n);
        std::copy_n(std::begin(xl_user), num_var_, std::begin(xl_solver));
        std::copy_n(std::begin(xu_user), num_var_, std::begin(xu_solver));
        std::copy_n(std::begin(y_user), num_constr_, std::begin(y_solver));
        std::copy_n(std::begin(zl_user), num_var_, std::begin(zl_solver));
        std::copy_n(std::begin(zu_user), num_var_, std::begin(zu_solver));

        for (Int i = 0; i < m; i++) {
            switch (constr_type_[i]) {
            case '=':
                assert(lb_[n+i] == 0.0 && ub_[n+i] == 0.0);
                // For a fixed slack variable xl, xu, zl and zu won't be used
                // by the IPM. Just put them to zero.
                xl_solver[n+i] = 0.0;
                xu_solver[n+i] = 0.0;
                zl_solver[n+i] = 0.0;
                zu_solver[n+i] = 0.0;
                break;
            case '<':
                assert(lb_[n+i] == 0.0 && ub_[n+i] == INFINITY);
                xl_solver[n+i] = slack_user[i];
                xu_solver[n+i] = INFINITY;
                zl_solver[n+i] = -y_user[i];
                zu_solver[n+i] = 0.0;
                break;
            case '>':
                assert(lb_[n+i] == -INFINITY && ub_[n+i] == 0.0);
                xl_solver[n+i] = INFINITY;
                xu_solver[n+i] = -slack_user[i];
                zl_solver[n+i] = 0.0;
                zu_solver[n+i] = y_user[i];
                break;
            }
        }
    }
}